

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall TApp_FallThroughPositional_Test::TestBody(TApp_FallThroughPositional_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  App *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  allocator local_122;
  allocator local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8 [32];
  iterator local_d8;
  size_type local_d0;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  int local_14;
  TApp_FallThroughPositional_Test *pTStack_10;
  int val;
  TApp_FallThroughPositional_Test *this_local;
  
  this_00 = &(this->super_TApp).app;
  pTStack_10 = this;
  CLI::App::fallthrough(this_00,true);
  local_14 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"val",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"",&local_71);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(this_00,&local_38,&local_14,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"sub",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"",&local_c1);
  CLI::App::add_subcommand(&(this->super_TApp).app,&local_98,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  local_120 = &local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"sub",&local_121);
  local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"2",&local_122);
  local_d8 = &local_118;
  local_d0 = 2;
  __l._M_len = 2;
  __l._M_array = local_d8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8;
  do {
    local_188 = local_188 + -1;
    std::__cxx11::string::~string((string *)local_188);
  } while (local_188 != &local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_122);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  TApp::run(&this->super_TApp);
  return;
}

Assistant:

TEST_F(TApp, FallThroughPositional) {
    app.fallthrough();
    int val = 1;
    app.add_option("val", val);

    app.add_subcommand("sub");

    args = {"sub", "2"};
    // Should not throw
    run();
}